

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglInfoTests.cpp
# Opt level: O0

void __thiscall deqp::egl::QueryStringCase::validateString(QueryStringCase *this,string *result)

{
  int iVar1;
  reference s;
  size_type sVar2;
  MessageBuilder *pMVar3;
  const_reference pvVar4;
  MessageBuilder local_3b8;
  string local_238;
  int local_214;
  undefined1 local_210 [4];
  int stringMinor;
  int local_1ec;
  undefined1 local_1e8 [4];
  int stringMajor;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  versionTokens;
  int dispMinor;
  int local_3c;
  undefined1 local_38 [4];
  int dispMajor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  TestLog *log;
  string *result_local;
  QueryStringCase *this_local;
  
  tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)tcu::TestContext::getLog
                          ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.
                           m_testCtx);
  de::splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38,result,' ');
  if (this->m_query == 0x3054) {
    local_3c = eglu::Version::getMajor(&(this->super_InfoCase).m_version);
    versionTokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         eglu::Version::getMinor(&(this->super_InfoCase).m_version);
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,0);
    de::splitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68,s,'.');
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_68);
    if (sVar2 < 2) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_1e8,
                 (TestLog *)
                 tokens.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1e8,
                          (char (*) [85])
                          "  Fail, first part of the string must be in the format <major_version.minor_version>"
                         );
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1e8);
      tcu::TestContext::setTestResult
                ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Invalid version string");
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,0);
      std::__cxx11::string::string((string *)local_210,(string *)pvVar4);
      iVar1 = toInt((string *)local_210);
      std::__cxx11::string::~string((string *)local_210);
      local_1ec = iVar1;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_68,1);
      std::__cxx11::string::string((string *)&local_238,(string *)pvVar4);
      iVar1 = toInt(&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      local_214 = iVar1;
      if ((local_1ec != local_3c) ||
         (iVar1 != (int)versionTokens.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)) {
        tcu::TestLog::operator<<
                  (&local_3b8,
                   (TestLog *)
                   tokens.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (&local_3b8,(char (*) [24])"  Fail, version numer (");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1ec);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x58517c);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_214);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (pMVar3,(char (*) [53])
                                   ") does not match the one reported by eglInitialize (");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_3c);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x58517c);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (pMVar3,(int *)&versionTokens.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x5b492c);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3b8);
        tcu::TestContext::setTestResult
                  ((this->super_InfoCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Version number mismatch");
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void validateString (const std::string& result)
	{
		tcu::TestLog&				log		= m_testCtx.getLog();
		std::vector<std::string>	tokens	= de::splitString(result, ' ');

		if (m_query == EGL_VERSION)
		{
			const int	dispMajor	= m_version.getMajor();
			const int	dispMinor	= m_version.getMinor();

			const std::vector<std::string>	versionTokens	= de::splitString(tokens[0], '.');

			if (versionTokens.size() < 2)
			{
				log << TestLog::Message << "  Fail, first part of the string must be in the format <major_version.minor_version>" << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid version string");
			}
			else
			{
				const	int	stringMajor	= toInt(versionTokens[0]);
				const	int	stringMinor	= toInt(versionTokens[1]);

				if (stringMajor != dispMajor || stringMinor != dispMinor)
				{
					log << TestLog::Message << "  Fail, version numer (" << stringMajor << "." << stringMinor
						<< ") does not match the one reported by eglInitialize (" << dispMajor << "." << dispMinor << ")" << TestLog::EndMessage;
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Version number mismatch");
				}
			}
		}
	}